

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

bool __thiscall
Catch::Matchers::StdString::ContainsMatcher::match(ContainsMatcher *this,string *source)

{
  bool bVar1;
  string *in_RDI;
  string *in_stack_ffffffffffffffa8;
  CasedString local_30;
  
  CasedString::adjustString(&local_30,in_RDI);
  bVar1 = contains(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool ContainsMatcher::match( std::string const& source ) const {
            return contains( m_comparator.adjustString( source ), m_comparator.m_str );
        }